

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icrs2obs.cpp
# Opt level: O1

CEExecOptions * DefineOpts(void)

{
  CEExecOptions *in_RDI;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"icrs2obs",(allocator *)&local_90);
  CEExecOptions::CEExecOptions(in_RDI,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_90);
  std::__cxx11::string::string((string *)&local_30);
  std::operator+(&local_70,&local_30,"Converts from ICRS (solar system barycentric) coordinates to "
                );
  std::operator+(&local_50,&local_70,
                 "observed altitude, zenith coordinates for a given Julian date. ");
  std::operator+(&local_90,&local_50,
                 "Additional observing parameters can also be supplied for more ");
  std::operator+(&local_b0,&local_90,"accurate coordinate values");
  CLOptions::AddProgramDescription(&in_RDI->super_CLOptions,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  CEExecOptions::AddIcrsPars(in_RDI);
  CEExecOptions::AddObserverPars(in_RDI);
  CEExecOptions::AddJDPar(in_RDI);
  return in_RDI;
}

Assistant:

CEExecOptions DefineOpts()
{
    CEExecOptions opts("icrs2obs");
    
    // Add version and description
    opts.AddProgramDescription(std::string() +
        "Converts from ICRS (solar system barycentric) coordinates to " +
        "observed altitude, zenith coordinates for a given Julian date. " +
        "Additional observing parameters can also be supplied for more " +
        "accurate coordinate values");

    // Setup the options
    opts.AddIcrsPars();
    opts.AddObserverPars();
    opts.AddJDPar();
    
    return opts;
}